

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

void InitClassMap(FClassMap *themap,SpawnMap *thedata)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  FName local_44;
  PClassActor *local_40;
  PClassActor *cls;
  Pair *pPStack_30;
  int error;
  Pair *pair;
  Iterator it;
  SpawnMap *thedata_local;
  FClassMap *themap_local;
  
  it._8_8_ = thedata;
  TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::Clear(themap,1);
  TMapIterator<int,_MapinfoSpawnItem,_TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>_>
  ::TMapIterator((TMapIterator<int,_MapinfoSpawnItem,_TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>_>
                  *)&pair,(TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>
                           *)it._8_8_);
  cls._4_4_ = 0;
  while (bVar2 = TMapIterator<int,_MapinfoSpawnItem,_TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>_>
                 ::NextPair((TMapIterator<int,_MapinfoSpawnItem,_TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>_>
                             *)&pair,&stack0xffffffffffffffd0), bVar2) {
    local_40 = (PClassActor *)0x0;
    bVar2 = FName::operator!=(&(pPStack_30->Value).classname,NAME_None);
    if (bVar2) {
      FName::FName(&local_44,&(pPStack_30->Value).classname);
      local_40 = PClass::FindActor(&local_44);
      if (local_40 == (PClassActor *)0x0) {
        pcVar3 = FString::GetChars(&(pPStack_30->Value).filename);
        uVar1 = (pPStack_30->Value).linenum;
        pcVar4 = FName::GetChars(&(pPStack_30->Value).classname);
        Printf("\x1cGScript error, \"%s\" line %d:\nUnknown actor class %s\n",pcVar3,(ulong)uVar1,
               pcVar4);
        cls._4_4_ = cls._4_4_ + 1;
      }
      TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::Insert
                (themap,pPStack_30->Key,&local_40);
    }
    else {
      TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::Remove
                (themap,pPStack_30->Key);
    }
  }
  if (0 < (int)cls._4_4_) {
    I_Error("%d unknown actor classes found",(ulong)cls._4_4_);
  }
  TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::Clear
            ((TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *)
             it._8_8_,1);
  return;
}

Assistant:

void InitClassMap(FClassMap &themap, SpawnMap &thedata)
{
	themap.Clear();
	SpawnMap::Iterator it(thedata);
	SpawnMap::Pair *pair;
	int error = 0;

	while (it.NextPair(pair))
	{
		PClassActor *cls = NULL;
		if (pair->Value.classname != NAME_None)
		{
			cls = PClass::FindActor(pair->Value.classname);
			if (cls == NULL)
			{
				Printf(TEXTCOLOR_RED "Script error, \"%s\" line %d:\nUnknown actor class %s\n",
					pair->Value.filename.GetChars(), pair->Value.linenum, pair->Value.classname.GetChars());
				error++;
			}
			themap.Insert(pair->Key, cls);
		}
		else
		{
			themap.Remove(pair->Key);
		}
	}
	if (error > 0)
	{
		I_Error("%d unknown actor classes found", error);
	}
	thedata.Clear();	// we do not need this any longer
}